

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crab-cups.cpp
# Opt level: O2

cups_t * read_input_abi_cxx11_(cups_t *__return_storage_ptr__,string_view input)

{
  pointer pcVar1;
  size_t sVar2;
  string local_50;
  
  (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  _M_node._M_size = 0;
  for (sVar2 = 0; input._M_len != sVar2; sVar2 = sVar2 + 1) {
    local_50.field_2._M_local_buf[0] = input._M_str[sVar2];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 1;
    local_50.field_2._M_local_buf[1] = '\0';
    pcVar1 = (pointer)std::__cxx11::stoull(&local_50,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_50);
    local_50._M_dataplus._M_p = pcVar1;
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (__return_storage_ptr__,(value_type_conflict *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

auto read_input(std::string_view input) {
  auto cups = cups_t {};
  ranges::transform(input, std::back_inserter(cups), [](char ch){
    return std::stoull(std::string{ch});
  });
  return cups;
}